

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O2

void __thiscall MidiPlayerDialog::on_saveListButton_clicked(MidiPlayerDialog *this)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  undefined4 uVar5;
  int iVar6;
  Master *this_00;
  QSettings *pQVar7;
  QListWidgetItem *this_01;
  QTextStream *pQVar8;
  int iVar9;
  QFile listFile;
  anon_union_24_3_e3d07ef4_for_data local_78;
  QString fileName;
  QTextStream listStream;
  
  if (on_saveListButton_clicked()::currentDir == '\0') {
    iVar9 = __cxa_guard_acquire(&on_saveListButton_clicked()::currentDir);
    if (iVar9 != 0) {
      QString::QString(&on_saveListButton_clicked::currentDir,(char *)0x0);
      __cxa_atexit(QString::~QString,&on_saveListButton_clicked::currentDir,&__dso_handle);
      __cxa_guard_release(&on_saveListButton_clicked()::currentDir);
    }
  }
  this_00 = Master::getInstance();
  pQVar7 = Master::getSettings(this_00);
  QString::QString((QString *)&listFile,"Master/qFileDialogOptions");
  QVariant::QVariant((QVariant *)&local_78,0);
  QSettings::value(&fileName,(QVariant *)pQVar7);
  uVar5 = QVariant::toInt((bool *)&fileName);
  QVariant::~QVariant((QVariant *)&fileName);
  QVariant::~QVariant((QVariant *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&listFile);
  QString::QString((QString *)&local_78,(char *)0x0);
  QString::QString((QString *)&listFile,"Play list files (*.*)");
  QFileDialog::getSaveFileName
            (&fileName,this,&local_78,&on_saveListButton_clicked::currentDir,&listFile,0,uVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&listFile);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  if (fileName.d.size != 0) {
    QDir::QDir((QDir *)&listFile,&fileName);
    QDir::absolutePath();
    qVar3 = on_saveListButton_clicked::currentDir.d.size;
    pcVar2 = on_saveListButton_clicked::currentDir.d.ptr;
    pDVar1 = on_saveListButton_clicked::currentDir.d.d;
    on_saveListButton_clicked::currentDir.d.d = (Data *)local_78.shared;
    on_saveListButton_clicked::currentDir.d.ptr = (char16_t *)local_78._8_8_;
    local_78.shared = (PrivateShared *)pDVar1;
    local_78._8_8_ = pcVar2;
    on_saveListButton_clicked::currentDir.d.size = local_78._16_8_;
    local_78._16_8_ = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    QDir::~QDir((QDir *)&listFile);
    QFile::QFile(&listFile,&fileName);
    cVar4 = QFile::open(&listFile,2);
    if (cVar4 != '\0') {
      QTextStream::QTextStream(&listStream,(QIODevice *)&listFile);
      iVar9 = 0;
      while( true ) {
        iVar6 = QListWidget::count();
        if (iVar6 <= iVar9) break;
        this_01 = (QListWidgetItem *)QListWidget::item((int)*(undefined8 *)(this->ui + 0x18));
        QListWidgetItem::text((QString *)&local_78,this_01);
        pQVar8 = (QTextStream *)QTextStream::operator<<(&listStream,(QString *)&local_78);
        Qt::endl(pQVar8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
        iVar9 = iVar9 + 1;
      }
      QTextStream::~QTextStream(&listStream);
    }
    QFile::~QFile(&listFile);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&fileName.d);
  return;
}

Assistant:

void MidiPlayerDialog::on_saveListButton_clicked() {
	static QString currentDir = NULL;
	QFileDialog::Options qFileDialogOptions = QFileDialog::Options(Master::getInstance()->getSettings()->value("Master/qFileDialogOptions", 0).toInt());
	QString fileName = QFileDialog::getSaveFileName(this, NULL, currentDir, "Play list files (*.*)",
		NULL, qFileDialogOptions);
	if (!fileName.isEmpty()) {
		currentDir = QDir(fileName).absolutePath();
		QFile listFile(fileName);
		if (!listFile.open(QIODevice::WriteOnly)) return;
		QTextStream listStream(&listFile);
		for (int i = 0; i < ui->playList->count(); i++) {
#if QT_VERSION >= QT_VERSION_CHECK(5, 15, 0)
			using Qt::endl;
#endif
			listStream << ui->playList->item(i)->text() << endl;
		}
	}
}